

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::
Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>_>
::expand(Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>_>
         *this)

{
  bool *pbVar1;
  bool *pbVar2;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>
  *__ptr;
  undefined8 uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>
  *ppVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  bool bVar10;
  
  sVar9 = 8;
  if (this->_capacity != 0) {
    sVar9 = this->_capacity * 2;
  }
  ppVar6 = (pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>
            *)Lib::alloc(sVar9 * 0x20);
  sVar8 = this->_capacity;
  if (sVar8 == 0) {
    sVar8 = 0;
  }
  else {
    __ptr = this->_stack;
    lVar7 = 0;
    while (bVar10 = sVar8 != 0, sVar8 = sVar8 - 1, bVar10) {
      pbVar1 = &(__ptr->first).q + lVar7;
      uVar3 = *(undefined8 *)pbVar1;
      uVar4 = ((TermList *)(pbVar1 + 8))->_content;
      pbVar1 = &(__ptr->second).q + lVar7;
      uVar5 = ((TermList *)(pbVar1 + 8))->_content;
      pbVar2 = &(ppVar6->second).q + lVar7;
      *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
      ((TermList *)(pbVar2 + 8))->_content = uVar5;
      pbVar1 = &(ppVar6->first).q + lVar7;
      *(undefined8 *)pbVar1 = uVar3;
      ((TermList *)(pbVar1 + 8))->_content = uVar4;
      lVar7 = lVar7 + 0x20;
    }
    Lib::free(__ptr);
    sVar8 = this->_capacity;
  }
  this->_stack = ppVar6;
  this->_cursor = ppVar6 + sVar8;
  this->_end = ppVar6 + sVar9;
  this->_capacity = sVar9;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }